

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::Read(ON_NurbsSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  double *p;
  int i;
  uint uVar3;
  int i_00;
  int j;
  int cv_count1;
  int cv_count0;
  int order1;
  int order0;
  int is_rat;
  int dim;
  int reserved2;
  int reserved1;
  int major_version;
  int minor_version;
  ON_BoundingBox bbox;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  major_version = 0;
  minor_version = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
  if ((!bVar1) || (major_version != 1)) {
    if (bVar1) {
      return true;
    }
    goto LAB_005558bf;
  }
  dim = 0;
  is_rat = 0;
  order0 = 0;
  order1 = 0;
  cv_count0 = 0;
  cv_count1 = 0;
  reserved1 = 0;
  reserved2 = 0;
  bVar1 = ON_BinaryArchive::ReadInt(file,&dim);
  if (((((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(file,&is_rat), bVar1)) &&
       (bVar1 = ON_BinaryArchive::ReadInt(file,&order0), bVar1)) &&
      ((bVar1 = ON_BinaryArchive::ReadInt(file,&order1), bVar1 &&
       (bVar1 = ON_BinaryArchive::ReadInt(file,&cv_count0), bVar1)))) &&
     ((bVar1 = ON_BinaryArchive::ReadInt(file,&cv_count1), bVar1 &&
      ((bVar1 = ON_BinaryArchive::ReadInt(file,&reserved1), bVar1 &&
       (bVar1 = ON_BinaryArchive::ReadInt(file,&reserved2), bVar1)))))) {
    ON_BoundingBox::ON_BoundingBox(&bbox);
    bVar1 = ON_BinaryArchive::ReadBoundingBox(file,&bbox);
    Create(this,dim,is_rat != 0,order0,order1,cv_count0,cv_count1);
    bbox.m_min.x._0_4_ = 0;
    if (((!bVar1) ||
        (bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&bbox),
        bbox.m_min.x._0_4_ < 0 || !bVar1)) ||
       (bVar1 = ReserveKnotCapacity(this,0,bbox.m_min.x._0_4_), !bVar1)) goto LAB_00555903;
    bVar1 = ON_BinaryArchive::ReadDouble(file,(long)bbox.m_min.x._0_4_,this->m_knot[0]);
    bbox.m_min.x._0_4_ = 0;
    if (((!bVar1) ||
        (bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&bbox),
        bbox.m_min.x._0_4_ < 0 || !bVar1)) ||
       (bVar1 = ReserveKnotCapacity(this,1,bbox.m_min.x._0_4_), !bVar1)) goto LAB_00555903;
    bVar2 = ON_BinaryArchive::ReadDouble(file,(long)bbox.m_min.x._0_4_,this->m_knot[1]);
    bbox.m_min.x._0_4_ = 0;
    bVar1 = false;
    if (bVar2) {
      bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&bbox);
    }
  }
  else {
    Create(this,dim,is_rat != 0,order0,order1,cv_count0,cv_count1);
LAB_00555903:
    bbox.m_min.x._0_4_ = 0;
    bVar1 = false;
  }
  uVar3 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
  if ((-1 < bbox.m_min.x._0_4_ & bVar1) == 1) {
    bVar1 = ReserveCVCapacity(this,bbox.m_min.x._0_4_ * uVar3);
  }
  else {
    bVar1 = false;
  }
  if (((bVar1 != false) && (0 < (int)uVar3)) && (0 < bbox.m_min.x._0_4_)) {
    i_00 = 0;
    bVar1 = true;
    while ((i_00 < this->m_cv_count[0] && (bVar1 != false))) {
      j = 0;
      while ((j < this->m_cv_count[1] && (bVar1 != false))) {
        p = CV(this,i_00,j);
        bVar1 = ON_BinaryArchive::ReadDouble(file,(ulong)uVar3,p);
        j = j + 1;
      }
      i_00 = i_00 + 1;
    }
  }
  if (bVar1 != false) {
    return true;
  }
LAB_005558bf:
  Destroy(this);
  return false;
}

Assistant:

bool ON_NurbsSurface::Read(
       ON_BinaryArchive&  file // open binary file
     )
{
  DestroySurfaceTree();
  // NOTE - check legacy I/O code if changed
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) {
    // common to all 1.x versions
    int dim = 0, is_rat = 0, order0 = 0, order1 = 0, cv_count0 = 0, cv_count1 = 0;
    int reserved1 = 0, reserved2 = 0;
    if (rc) rc = file.ReadInt( &dim );
    if (rc) rc = file.ReadInt( &is_rat );
    if (rc) rc = file.ReadInt( &order0 );
    if (rc) rc = file.ReadInt( &order1 );
    if (rc) rc = file.ReadInt( &cv_count0 );
    if (rc) rc = file.ReadInt( &cv_count1 );

    if (rc) rc = file.ReadInt(&reserved1);
    if (rc) rc = file.ReadInt(&reserved2);

    if (rc) {
      ON_BoundingBox bbox; // read bounding box - may be used in future
      rc = file.ReadBoundingBox(bbox);
    }
    
    Create( dim, is_rat, order0, order1, cv_count0, cv_count1 );

    int count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    if (rc ) rc = ReserveKnotCapacity(0,count);
    if (rc) rc = file.ReadDouble( count, m_knot[0] );

    count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    if (rc ) rc = ReserveKnotCapacity(1,count);
    if (rc) rc = file.ReadDouble( count, m_knot[1] );

    count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    const int cv_size = CVSize();
    if (rc) rc = ReserveCVCapacity( count*cv_size );
    if (count > 0 && cv_size > 0 && rc ) {
      int i, j;
      for ( i = 0; i < m_cv_count[0] && rc; i++ ) {
        for ( j = 0; j < m_cv_count[1] && rc; j++ ) {
          rc = file.ReadDouble( cv_size, CV(i,j) );
        }
      }
    }
  }
  if ( !rc )
    Destroy();
  return rc;
}